

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS
ref_clump_zone_around
          (FILE *f,REF_CELL ref_cell,REF_DICT ref_dict,char *zonetype,REF_DICT node_dict,
          REF_NODE ref_node,REF_INT node)

{
  uint uVar1;
  REF_GLOB local_1e0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL jacob [9];
  REF_DBL local_138;
  REF_DBL m [6];
  int local_fc;
  double dStack_f8;
  REF_INT local;
  REF_DBL xyz_phys [3];
  REF_DBL local_d8;
  REF_DBL xyz_comp [3];
  REF_INT local_b8 [2];
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_NODE ref_node_local;
  REF_DICT node_dict_local;
  char *zonetype_local;
  REF_DICT ref_dict_local;
  REF_CELL ref_cell_local;
  FILE *f_local;
  
  if (ref_dict->n < 1) {
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = ref_node_metric_get(ref_node,node,&local_138);
    if (f_local._4_4_ == 0) {
      f_local._4_4_ = ref_matrix_jacob_m(&local_138,(REF_DBL *)&ref_private_macro_code_rss_1);
      if (f_local._4_4_ == 0) {
        fprintf((FILE *)f,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                zonetype,(ulong)(uint)node_dict->n,(ulong)(uint)ref_dict->n,"point",zonetype);
        for (cell_node = 0; cell_node < node_dict->n; cell_node = cell_node + 1) {
          local_fc = node_dict->key[cell_node];
          dStack_f8 = ref_node->real[local_fc * 0xf] - ref_node->real[node * 0xf];
          xyz_phys[0] = ref_node->real[local_fc * 0xf + 1] - ref_node->real[node * 0xf + 1];
          xyz_phys[1] = ref_node->real[local_fc * 0xf + 2] - ref_node->real[node * 0xf + 2];
          uVar1 = ref_matrix_vect_mult
                            ((REF_DBL *)&ref_private_macro_code_rss_1,&stack0xffffffffffffff08,
                             &local_d8);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x3b,"ref_clump_zone_around",(ulong)uVar1,"ax");
            return uVar1;
          }
          if (((local_fc < 0) || (ref_node->max <= local_fc)) || (ref_node->global[local_fc] < 0)) {
            local_1e0 = -1;
          }
          else {
            local_1e0 = ref_node->global[local_fc];
          }
          fprintf((FILE *)f," %.16e %.16e %.16e %.16e %.16e %.16e %ld\n",
                  ref_node->real[local_fc * 0xf],ref_node->real[local_fc * 0xf + 1],
                  ref_node->real[local_fc * 0xf + 2],local_d8,xyz_comp[0],xyz_comp[1],local_1e0);
        }
        for (cell_node = 0; cell_node < ref_dict->n; cell_node = cell_node + 1) {
          nodes[0x1a] = ref_dict->key[cell_node];
          uVar1 = ref_cell_nodes(ref_cell,nodes[0x1a],local_b8);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x44,"ref_clump_zone_around",(ulong)uVar1,"n");
            return uVar1;
          }
          for (nodes[0x19] = 0; nodes[0x19] < ref_cell->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar1 = ref_dict_location(node_dict,nodes[(long)nodes[0x19] + -2],&local_fc);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x46,"ref_clump_zone_around",(ulong)uVar1,"ret");
              return uVar1;
            }
            fprintf((FILE *)f," %d",(ulong)(local_fc + 1));
          }
          fprintf((FILE *)f,"\n");
        }
        f_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x2d,"ref_clump_zone_around",(ulong)f_local._4_4_,"jac");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x2c,
             "ref_clump_zone_around",(ulong)f_local._4_4_,"get");
    }
  }
  return f_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_clump_zone_around(
    FILE *f, REF_CELL ref_cell, REF_DICT ref_dict, const char *zonetype,
    REF_DICT node_dict, REF_NODE ref_node, REF_INT node) {
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_INT local;
  REF_DBL m[6], jacob[9];

  if (ref_dict_n(ref_dict) <= 0) return REF_SUCCESS;

  RSS(ref_node_metric_get(ref_node, node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");

  fprintf(
      f, "zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      zonetype, ref_dict_n(node_dict), ref_dict_n(ref_dict), "point", zonetype);

  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] =
        ref_node_xyz(ref_node, 0, local) - ref_node_xyz(ref_node, 0, node);
    xyz_phys[1] =
        ref_node_xyz(ref_node, 1, local) - ref_node_xyz(ref_node, 1, node);
    xyz_phys[2] =
        ref_node_xyz(ref_node, 2, local) - ref_node_xyz(ref_node, 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e %.16e %.16e %.16e " REF_GLOB_FMT "\n",
            ref_node_xyz(ref_node, 0, local), ref_node_xyz(ref_node, 1, local),
            ref_node_xyz(ref_node, 2, local), xyz_comp[0], xyz_comp[1],
            xyz_comp[2], ref_node_global(ref_node, local));
  }

  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    fprintf(f, "\n");
  }

  return REF_SUCCESS;
}